

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

bool __thiscall
capnp::compiler::ValueTranslator::matchesType
          (ValueTranslator *this,Reader src,Type type,Orphan<capnp::DynamicValue> *result)

{
  uint8_t uVar1;
  uint uVar2;
  ulong uVar3;
  uint64_t uVar4;
  Schema SVar5;
  anon_union_2_2_d12d5221_for_Type_3 aVar6;
  ulong uVar7;
  Which WVar8;
  ulong uVar9;
  bool bVar10;
  byte bVar11;
  ReaderFor<DynamicEnum> RVar12;
  Type local_e8;
  Reader local_d8;
  Schema local_90;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_88;
  Type local_80;
  ReaderFor<DynamicList> local_70;
  
  local_e8.field_4 = type.field_4;
  uVar3 = type._0_8_;
  local_e8._0_8_ = uVar3;
  if (ANY_POINTER < result->type) {
switchD_00134d65_caseD_0:
    kj::_::unreachable();
  }
  uVar1 = type.listDepth;
  WVar8 = type.baseType;
  switch(result->type) {
  case UNKNOWN:
    goto switchD_00134d65_caseD_0;
  case VOID:
    bVar10 = WVar8 == VOID;
    break;
  case BOOL:
    bVar10 = WVar8 == BOOL;
    break;
  case INT:
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    uVar3 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(&local_d8);
    DynamicValue::Reader::~Reader(&local_d8);
    if (-1 < (long)uVar3) {
      uVar3 = local_e8._0_8_ & 0xffff;
      uVar1 = local_e8.listDepth;
      goto switchD_00134d65_caseD_4;
    }
    WVar8 = LIST;
    if (local_e8.listDepth == '\0') {
      WVar8 = local_e8.baseType;
    }
    bVar11 = 0;
    switch(WVar8) {
    case INT8:
      uVar7 = 0xffffffffffffff80;
      break;
    case INT16:
      uVar7 = 0xffffffffffff8000;
      break;
    case INT32:
      uVar7 = 0xffffffff80000000;
      break;
    case INT64:
    case FLOAT32:
    case FLOAT64:
      goto switchD_00135006_caseD_5;
    case UINT8:
    case UINT16:
    case UINT32:
    case UINT64:
      uVar7 = 0;
      goto LAB_00135087;
    default:
      goto switchD_00135006_default;
    }
    bVar11 = 1;
    if (uVar3 < uVar7) {
LAB_00135087:
      uVar3 = 0;
      if (src._reader.dataSize < 0x40) {
        uVar9 = 0;
      }
      else {
        uVar9 = (ulong)*(uint *)((long)src._reader.data + 4);
        if (0x9f < src._reader.dataSize) {
          uVar3 = (ulong)*(uint *)((long)src._reader.data + 0x10);
        }
      }
      (**this->errorReporter->_vptr_ErrorReporter)
                (this->errorReporter,uVar9,uVar3,"Integer value out of range.",0x1c);
      result->type = INT;
      (result->field_1).intValue = uVar7;
      *(undefined8 *)((long)&result->field_1 + 8) = local_d8._0_8_;
      if ((result->builder).segment != (SegmentBuilder *)0x0) {
        capnp::_::OrphanBuilder::euthanize(&result->builder);
      }
      (result->builder).capTable = (CapTableBuilder *)0x0;
      (result->builder).location = (word *)0x0;
      (result->builder).tag.content = 0;
      (result->builder).segment = (SegmentBuilder *)0x0;
switchD_00135006_caseD_5:
      bVar11 = 1;
    }
    goto switchD_00135006_default;
  case UINT:
switchD_00134d65_caseD_4:
    uVar2 = 0xc;
    if (uVar1 == '\0') {
      uVar2 = (int)uVar3 - 2;
    }
    if ((ushort)uVar2 < 10) {
      uVar3 = *(ulong *)(&DAT_001c06f8 + (ulong)(uVar2 & 0xffff) * 8);
      Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
      uVar4 = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(&local_d8);
      DynamicValue::Reader::~Reader(&local_d8);
      bVar11 = 1;
      if (uVar3 < uVar4) {
        uVar7 = 0;
        if (src._reader.dataSize < 0x40) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)*(uint *)((long)src._reader.data + 4);
          if (0x9f < src._reader.dataSize) {
            uVar7 = (ulong)*(uint *)((long)src._reader.data + 0x10);
          }
        }
        (**this->errorReporter->_vptr_ErrorReporter)
                  (this->errorReporter,uVar9,uVar7,"Integer value out of range.",0x1c);
        result->type = UINT;
        (result->field_1).uintValue = uVar3;
        *(undefined8 *)((long)&result->field_1 + 8) = local_d8._0_8_;
        if ((result->builder).segment != (SegmentBuilder *)0x0) {
          capnp::_::OrphanBuilder::euthanize(&result->builder);
        }
        (result->builder).capTable = (CapTableBuilder *)0x0;
        (result->builder).location = (word *)0x0;
        (result->builder).tag.content = 0;
        (result->builder).segment = (SegmentBuilder *)0x0;
      }
      goto switchD_00135006_default;
    }
    goto LAB_00134e88;
  case FLOAT:
    bVar11 = 1;
    if (WVar8 != FLOAT32 || uVar1 != '\0') {
      bVar11 = WVar8 == FLOAT64 && uVar1 == '\0';
    }
    goto switchD_00135006_default;
  case TEXT:
    bVar10 = WVar8 == TEXT;
    break;
  case DATA:
    bVar10 = WVar8 == DATA;
    break;
  case LIST:
    if (uVar1 == '\0') {
      bVar11 = 0;
      if (WVar8 == ANY_POINTER) {
        aVar6.paramIndex = type.field_3.paramIndex;
        if (local_e8.field_4.schema != (RawBrandedSchema *)0x0) {
          aVar6.paramIndex = 0;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          aVar6.paramIndex = 0;
        }
        if (3 < aVar6.paramIndex) goto switchD_00134d65_caseD_0;
        bVar11 = (byte)aVar6.paramIndex ^ 1;
      }
      goto switchD_00135006_default;
    }
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&local_70,&local_d8);
    local_90.raw = (RawBrandedSchema *)local_70.schema.elementType._0_8_;
    aStack_88 = local_70.schema.elementType.field_4;
    local_80 = (Type)Type::asList(&local_e8);
    bVar11 = Type::operator==((Type *)&local_90,&local_80);
    goto LAB_00134f55;
  case ENUM:
    if (uVar1 == '\0' && WVar8 == ENUM) {
      Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
      RVar12 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(&local_d8);
      local_70.schema.elementType._0_8_ = RVar12.schema.super_Schema.raw;
      SVar5.raw = (RawBrandedSchema *)Type::asEnum(&local_e8);
      goto LAB_00134f4e;
    }
LAB_00134e88:
    bVar11 = 0;
    goto switchD_00135006_default;
  case STRUCT:
    if (uVar1 != '\0' || WVar8 != STRUCT) {
      bVar11 = 0;
      if (WVar8 == ANY_POINTER && uVar1 == '\0') {
        aVar6.paramIndex = type.field_3.paramIndex;
        if (local_e8.field_4.schema != (RawBrandedSchema *)0x0) {
          aVar6.paramIndex = 0;
        }
        if ((uVar3 >> 0x18 & 1) != 0) {
          aVar6.paramIndex = 0;
        }
        if (3 < aVar6.paramIndex) goto switchD_00134d65_caseD_0;
        bVar11 = 3 >> ((byte)aVar6.paramIndex & 0xf);
      }
      goto switchD_00135006_default;
    }
    Orphan<capnp::DynamicValue>::getReader(&local_d8,result);
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicStruct> *)&local_70,&local_d8);
    SVar5.raw = (RawBrandedSchema *)Type::asStruct(&local_e8);
LAB_00134f4e:
    bVar11 = (RawBrandedSchema *)local_70.schema.elementType._0_8_ == SVar5.raw;
LAB_00134f55:
    DynamicValue::Reader::~Reader(&local_d8);
    goto switchD_00135006_default;
  case CAPABILITY:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38]>
              ((Fault *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7e7,FAILED,(char *)0x0,"\"Interfaces can\'t have literal values.\"",
               (char (*) [38])"Interfaces can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_d8);
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              ((Fault *)&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x7ea,FAILED,(char *)0x0,"\"AnyPointers can\'t have literal values.\"",
               (char (*) [39])"AnyPointers can\'t have literal values.");
    kj::_::Debug::Fault::fatal((Fault *)&local_d8);
  }
  bVar11 = uVar1 == '\0' & bVar10;
switchD_00135006_default:
  return (bool)(bVar11 & 1);
}

Assistant:

bool ValueTranslator::matchesType(Expression::Reader src, Type type, Orphan<DynamicValue>& result) {
  // compileValueInner() evaluated `src` and only used `type` as a hint in interpreting `src` if
  // `src`'s type wasn't already obvious. So, now we need to check that the resulting value
  // actually matches `type`.

  switch (result.getType()) {
    case DynamicValue::UNKNOWN:
      KJ_UNREACHABLE;

    case DynamicValue::VOID:
      return type.isVoid();

    case DynamicValue::BOOL:
      return type.isBool();

    case DynamicValue::INT: {
      int64_t value = result.getReader().as<int64_t>();
      if (value < 0) {
        int64_t minValue;
        switch (type.which()) {
          case schema::Type::INT8: minValue = (int8_t)kj::minValue; break;
          case schema::Type::INT16: minValue = (int16_t)kj::minValue; break;
          case schema::Type::INT32: minValue = (int32_t)kj::minValue; break;
          case schema::Type::INT64: minValue = (int64_t)kj::minValue; break;
          case schema::Type::UINT8: minValue = (uint8_t)kj::minValue; break;
          case schema::Type::UINT16: minValue = (uint16_t)kj::minValue; break;
          case schema::Type::UINT32: minValue = (uint32_t)kj::minValue; break;
          case schema::Type::UINT64: minValue = (uint64_t)kj::minValue; break;

          case schema::Type::FLOAT32:
          case schema::Type::FLOAT64:
            // Any integer is acceptable.
            minValue = (int64_t)kj::minValue;
            break;

          default: return false;
        }

        if (value < minValue) {
          errorReporter.addErrorOn(src, "Integer value out of range.");
          result = minValue;
        }
        return true;
      }

    } KJ_FALLTHROUGH;  // value is positive, so we can just go on to the uint case below.

    case DynamicValue::UINT: {
      uint64_t maxValue;
      switch (type.which()) {
        case schema::Type::INT8: maxValue = (int8_t)kj::maxValue; break;
        case schema::Type::INT16: maxValue = (int16_t)kj::maxValue; break;
        case schema::Type::INT32: maxValue = (int32_t)kj::maxValue; break;
        case schema::Type::INT64: maxValue = (int64_t)kj::maxValue; break;
        case schema::Type::UINT8: maxValue = (uint8_t)kj::maxValue; break;
        case schema::Type::UINT16: maxValue = (uint16_t)kj::maxValue; break;
        case schema::Type::UINT32: maxValue = (uint32_t)kj::maxValue; break;
        case schema::Type::UINT64: maxValue = (uint64_t)kj::maxValue; break;

        case schema::Type::FLOAT32:
        case schema::Type::FLOAT64:
          // Any integer is acceptable.
          maxValue = (uint64_t)kj::maxValue;
          break;

        default: return false;
      }

      if (result.getReader().as<uint64_t>() > maxValue) {
        errorReporter.addErrorOn(src, "Integer value out of range.");
        result = maxValue;
      }
      return true;
    }

    case DynamicValue::FLOAT:
      return type.isFloat32() || type.isFloat64();

    case DynamicValue::TEXT:
      return type.isText();

    case DynamicValue::DATA:
      return type.isData();

    case DynamicValue::LIST:
      if (type.isList()) {
        return result.getReader().as<DynamicList>().getSchema() == type.asList();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::LIST:
            return true;
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::ENUM:
      return type.isEnum() &&
             result.getReader().as<DynamicEnum>().getSchema() == type.asEnum();

    case DynamicValue::STRUCT:
      if (type.isStruct()) {
        return result.getReader().as<DynamicStruct>().getSchema() == type.asStruct();
      } else if (type.isAnyPointer()) {
        switch (type.whichAnyPointerKind()) {
          case schema::Type::AnyPointer::Unconstrained::ANY_KIND:
          case schema::Type::AnyPointer::Unconstrained::STRUCT:
            return true;
          case schema::Type::AnyPointer::Unconstrained::LIST:
          case schema::Type::AnyPointer::Unconstrained::CAPABILITY:
            return false;
        }
        KJ_UNREACHABLE;
      } else {
        return false;
      }

    case DynamicValue::CAPABILITY:
      KJ_FAIL_ASSERT("Interfaces can't have literal values.");

    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("AnyPointers can't have literal values.");
  }

  KJ_UNREACHABLE;
}